

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O1

void VP8IteratorBytesToNz(VP8EncIterator *it)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  auVar1 = *(undefined1 (*) [16])it->top_nz_;
  auVar2 = *(undefined1 (*) [16])(it->top_nz_ + 4);
  auVar3._8_4_ = 0x800000;
  auVar3._0_8_ = 0x8000000080000;
  auVar3._12_4_ = 0x800000;
  auVar4._8_4_ = 0x8000;
  auVar4._0_8_ = 0x200000002000;
  auVar4._12_4_ = 0x8000;
  *it->nz_ = (uint)((auVar4._8_8_ & 0xffffffff) * (ulong)auVar1._12_4_) |
             (uint)((auVar3._8_8_ & 0xffffffff) * (ulong)auVar2._12_4_) |
             auVar1._4_4_ * 0x2000 | auVar2._4_4_ * 0x80000 |
             (uint)((auVar1._8_8_ & 0xffffffff) * 0x4000) |
             (uint)((auVar2._8_8_ & 0xffffffff) * 0x400000) |
             auVar1._0_4_ * 0x1000 | auVar2._0_4_ * 0x40000 |
             it->left_nz_[6] << 0x15 | it->left_nz_[4] << 0x11 | it->left_nz_[2] << 0xb |
             it->left_nz_[1] << 7 | it->left_nz_[0] << 3 | it->top_nz_[8] << 0x18;
  return;
}

Assistant:

void VP8IteratorBytesToNz(VP8EncIterator* const it) {
  uint32_t nz = 0;
  const int* const top_nz = it->top_nz_;
  const int* const left_nz = it->left_nz_;
  // top
  nz |= (top_nz[0] << 12) | (top_nz[1] << 13);
  nz |= (top_nz[2] << 14) | (top_nz[3] << 15);
  nz |= (top_nz[4] << 18) | (top_nz[5] << 19);
  nz |= (top_nz[6] << 22) | (top_nz[7] << 23);
  nz |= (top_nz[8] << 24);  // we propagate the _top_ bit, esp. for intra4
  // left
  nz |= (left_nz[0] << 3) | (left_nz[1] << 7);
  nz |= (left_nz[2] << 11);
  nz |= (left_nz[4] << 17) | (left_nz[6] << 21);

  *it->nz_ = nz;
}